

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_file_block_manager.cpp
# Opt level: O2

void __thiscall
duckdb::SingleFileBlockManager::MarkBlockAsUsed(SingleFileBlockManager *this,block_id_t block_id)

{
  set<long,_std::less<long>,_std::allocator<long>_> *this_00;
  iterator iVar1;
  long lVar2;
  block_id_t *__v;
  block_id_t local_28;
  
  local_28 = block_id;
  ::std::mutex::lock(&this->block_lock);
  lVar2 = this->max_block;
  this_00 = &this->free_list;
  if (block_id < lVar2) {
    iVar1 = ::std::
            _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::find
                      (&this_00->_M_t,&local_28);
    if ((_Rb_tree_header *)iVar1._M_node == &(this->free_list)._M_t._M_impl.super__Rb_tree_header) {
      IncreaseBlockReferenceCountInternal(this,local_28);
    }
    else {
      ::std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
      erase(&this_00->_M_t,&local_28);
      ::std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
      erase(&(this->newly_freed_list)._M_t,&local_28);
    }
  }
  else {
    __v = &this->max_block;
    while (lVar2 < block_id) {
      ::std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
      _M_insert_unique<long_const&>
                ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *)
                 this_00,__v);
      lVar2 = *__v + 1;
      *__v = lVar2;
    }
    *__v = lVar2 + 1;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->block_lock);
  return;
}

Assistant:

void SingleFileBlockManager::MarkBlockAsUsed(block_id_t block_id) {
	lock_guard<mutex> lock(block_lock);
	D_ASSERT(block_id >= 0);
	if (max_block <= block_id) {
		// the block is past the current max_block
		// in this case we need to increment  "max_block" to "block_id"
		// any blocks in the middle are added to the free list
		// i.e. if max_block = 0, and block_id = 3, we need to add blocks 1 and 2 to the free list
		while (max_block < block_id) {
			free_list.insert(max_block);
			max_block++;
		}
		max_block++;
	} else if (free_list.find(block_id) != free_list.end()) {
		// block is currently in the free list - erase
		free_list.erase(block_id);
		newly_freed_list.erase(block_id);
	} else {
		// block is already in use - increase reference count
		IncreaseBlockReferenceCountInternal(block_id);
	}
}